

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O3

void PrintResults(CESkyCoord *input_icrs,CESkyCoord *observed_altaz,CESkyCoord *observed_icrs,
                 CEObserver *observer,CEDate *date)

{
  double dVar1;
  CEAngle local_80 [16];
  CEDate local_70 [64];
  
  putchar(10);
  puts("******************************************");
  puts("* Results of ICRS -> Observed conversion *");
  puts("******************************************");
  puts("Observed Coordinates (output)");
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)observed_altaz + 0x18))(local_80,observed_altaz,local_70);
  CEAngle::Deg();
  printf("    Azimuth        : %f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)observed_altaz + 0x20))(local_80,observed_altaz,local_70);
  CEAngle::Deg();
  printf("    Zenith         : %+f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)observed_altaz + 0x20))(local_80,observed_altaz,local_70);
  dVar1 = (double)CEAngle::Deg();
  printf("    Altitude       : %+f deg\n",90.0 - dVar1);
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  puts("ICRS Coordinates (input)");
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)input_icrs + 0x18))(local_80,input_icrs,local_70);
  CEAngle::Deg();
  printf("    Right Ascension: %f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)input_icrs + 0x20))(local_80,input_icrs,local_70);
  CEAngle::Deg();
  printf("    Declination    : %+f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  (**(code **)(*(long *)date + 0x20))(date);
  printf("    Julian Date    : %f\n");
  puts("Apparent ICRS Coordinates");
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)observed_icrs + 0x18))(local_80,observed_icrs,local_70);
  CEAngle::Deg();
  printf("    Right Ascension: %f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  CEDate::CEDate(local_70,2451545.0,JD);
  (**(code **)(*(long *)observed_icrs + 0x20))(local_80,observed_icrs,local_70);
  CEAngle::Deg();
  printf("    Declination    : %f deg\n");
  CEAngle::~CEAngle(local_80);
  CEDate::~CEDate(local_70);
  puts("Observer Info");
  printf("    Longitude      : %f deg\n",*(double *)(observer + 8) * 57.29577951308232);
  printf("    Latitude       : %+f deg\n",*(double *)(observer + 0x10) * 57.29577951308232);
  printf("    Elevation      : %f meters\n",*(undefined8 *)(observer + 0x18));
  printf("    Pressure       : %f hPa\n",*(undefined8 *)(observer + 0x20));
  printf("    Temperature    : %f Celsius\n",*(undefined8 *)(observer + 0x28));
  printf("    Relative Humid.: %f\n",*(undefined8 *)(observer + 0x30));
  putchar(10);
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input_icrs,
                  const CESkyCoord& observed_altaz,
                  const CESkyCoord& observed_icrs,
                  const CEObserver& observer,
                  const CEDate    & date)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of ICRS -> Observed conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (output)\n") ;
    std::printf("    Azimuth        : %f deg\n", observed_altaz.XCoord().Deg()) ;
    std::printf("    Zenith         : %+f deg\n", observed_altaz.YCoord().Deg()) ;
    std::printf("    Altitude       : %+f deg\n", 90.0-observed_altaz.YCoord().Deg()) ;
    std::printf("ICRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %f deg\n", input_icrs.XCoord().Deg()) ;
    std::printf("    Declination    : %+f deg\n", input_icrs.YCoord().Deg()) ;
    std::printf("    Julian Date    : %f\n", date.JD()) ;
    std::printf("Apparent ICRS Coordinates\n");
    std::printf("    Right Ascension: %f deg\n", observed_icrs.XCoord().Deg());
    std::printf("    Declination    : %f deg\n", observed_icrs.YCoord().Deg());
    std::printf("Observer Info\n") ;
    std::printf("    Longitude      : %f deg\n", observer.Longitude_Deg()) ;
    std::printf("    Latitude       : %+f deg\n", observer.Latitude_Deg()) ;
    std::printf("    Elevation      : %f meters\n", observer.Elevation_m()) ;
    std::printf("    Pressure       : %f hPa\n", observer.Pressure_hPa()) ;
    std::printf("    Temperature    : %f Celsius\n", observer.Temperature_C()) ;
    std::printf("    Relative Humid.: %f\n", observer.RelativeHumidity()) ;
    std::printf("\n") ;
}